

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * ae_strtofflags(char *s,unsigned_long *setp,unsigned_long *clrp)

{
  int iVar1;
  ulong *in_RDX;
  ulong *in_RSI;
  char *in_RDI;
  bool bVar2;
  char *failed;
  unsigned_long clear;
  unsigned_long set;
  flag *flag;
  char *end;
  char *start;
  char *local_48;
  ulong local_40;
  ulong local_38;
  flag *local_30;
  char *local_28;
  char *local_20;
  
  local_40 = 0;
  local_38 = 0;
  local_48 = (char *)0x0;
  local_20 = in_RDI;
  while( true ) {
    bVar2 = true;
    if ((*local_20 != '\t') && (bVar2 = true, *local_20 != ' ')) {
      bVar2 = *local_20 == ',';
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  do {
    if (*local_20 == '\0') {
      if (in_RSI != (ulong *)0x0) {
        *in_RSI = local_38;
      }
      if (in_RDX != (ulong *)0x0) {
        *in_RDX = local_40;
      }
      return local_48;
    }
    local_28 = local_20;
    while( true ) {
      bVar2 = false;
      if (((*local_28 != '\0') && (bVar2 = false, *local_28 != '\t')) &&
         (bVar2 = false, *local_28 != ' ')) {
        bVar2 = *local_28 != ',';
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
    for (local_30 = flags; local_30->name != (char *)0x0; local_30 = local_30 + 1) {
      iVar1 = memcmp(local_20,local_30->name,(long)local_28 - (long)local_20);
      if (iVar1 == 0) {
        local_40 = local_30->set | local_40;
        local_38 = local_30->clear | local_38;
        break;
      }
      iVar1 = memcmp(local_20,local_30->name + 2,(long)local_28 - (long)local_20);
      if (iVar1 == 0) {
        local_38 = local_30->set | local_38;
        local_40 = local_30->clear | local_40;
        break;
      }
    }
    if ((local_30->name == (char *)0x0) && (local_48 == (char *)0x0)) {
      local_48 = local_20;
    }
    local_20 = local_28;
    while( true ) {
      bVar2 = true;
      if ((*local_20 != '\t') && (bVar2 = true, *local_20 != ' ')) {
        bVar2 = *local_20 == ',';
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
  } while( true );
}

Assistant:

static const char *
ae_strtofflags(const char *s, unsigned long *setp, unsigned long *clrp)
{
	const char *start, *end;
	struct flag *flag;
	unsigned long set, clear;
	const char *failed;

	set = clear = 0;
	start = s;
	failed = NULL;
	/* Find start of first token. */
	while (*start == '\t'  ||  *start == ' '  ||  *start == ',')
		start++;
	while (*start != '\0') {
		/* Locate end of token. */
		end = start;
		while (*end != '\0'  &&  *end != '\t'  &&
		    *end != ' '  &&  *end != ',')
			end++;
		for (flag = flags; flag->name != NULL; flag++) {
			if (memcmp(start, flag->name, end - start) == 0) {
				/* Matched "noXXXX", so reverse the sense. */
				clear |= flag->set;
				set |= flag->clear;
				break;
			} else if (memcmp(start, flag->name + 2, end - start)
			    == 0) {
				/* Matched "XXXX", so don't reverse. */
				set |= flag->set;
				clear |= flag->clear;
				break;
			}
		}
		/* Ignore unknown flag names. */
		if (flag->name == NULL  &&  failed == NULL)
			failed = start;

		/* Find start of next token. */
		start = end;
		while (*start == '\t'  ||  *start == ' '  ||  *start == ',')
			start++;

	}

	if (setp)
		*setp = set;
	if (clrp)
		*clrp = clear;

	/* Return location of first failure. */
	return (failed);
}